

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall
TableBaseExpression::GenerateElementCode
          (TableBaseExpression *this,ExpressionPtr *key,ExpressionPtr *value,char eolChar,
          ostream *out,int n)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *this_01;
  element_type *peVar4;
  ulong uVar5;
  element_type *this_02;
  element_type *this_03;
  element_type *peVar6;
  string local_178;
  shared_ptr<Expression> local_158;
  undefined1 local_148 [8];
  shared_ptr<ConstantExpression> labelExp;
  undefined1 local_130 [8];
  shared_ptr<NewClassExpression> newClass;
  shared_ptr<FunctionExpression> func;
  string local_f0;
  undefined1 local_d0 [8];
  shared_ptr<ArrayIndexingExpression> derefExp;
  shared_ptr<OperatorExpression> local_b8;
  string local_a8;
  shared_ptr<Expression> local_78;
  undefined1 local_68 [8];
  shared_ptr<ConstantExpression> labelExp_1;
  string name;
  int n_local;
  ostream *out_local;
  char eolChar_local;
  ExpressionPtr *value_local;
  ExpressionPtr *key_local;
  TableBaseExpression *this_local;
  
  peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      value);
  iVar2 = (**peVar3->_vptr_Expression)();
  if (iVar2 != 7) {
    peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )value);
    iVar2 = (**peVar3->_vptr_Expression)();
    if (iVar2 != 0xb) goto LAB_00121b4e;
  }
  std::__cxx11::string::string
            ((string *)
             &labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<Expression>::shared_ptr(&local_78,key);
  ConstantExpression::AsLabelExpression((ConstantExpression *)local_68,&local_78);
  std::shared_ptr<Expression>::~shared_ptr(&local_78);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<ConstantExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ConstantExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ConstantExpression::GetLabel_abi_cxx11_(&local_a8,peVar6);
    std::__cxx11::string::operator=
              ((string *)
               &labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )key);
    derefExp.super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 0;
    iVar2 = (**peVar3->_vptr_Expression)();
    bVar1 = false;
    if (iVar2 == 5) {
      std::static_pointer_cast<OperatorExpression,Expression>((shared_ptr<Expression> *)&local_b8);
      derefExp.super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._7_1_ = 1;
      this_01 = std::
                __shared_ptr_access<OperatorExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<OperatorExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_b8);
      iVar2 = OperatorExpression::GetOperatorType(this_01);
      bVar1 = iVar2 == -0xfffff9;
    }
    if ((derefExp.super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) != 0) {
      std::shared_ptr<OperatorExpression>::~shared_ptr(&local_b8);
    }
    if (bVar1) {
      std::static_pointer_cast<ArrayIndexingExpression,Expression>
                ((shared_ptr<Expression> *)local_d0);
      peVar4 = std::
               __shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0);
      bVar1 = ArrayIndexingExpression::IsSimpleMemberDeref(peVar4);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)value);
        iVar2 = (**peVar3->_vptr_Expression)();
        if (iVar2 == 7) {
          peVar4 = std::
                   __shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0);
          ArrayIndexingExpression::ToFunctionNameString_abi_cxx11_(&local_f0,peVar4);
          std::__cxx11::string::operator=
                    ((string *)
                     &labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        else {
          peVar4 = std::
                   __shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_d0);
          ArrayIndexingExpression::ToString_abi_cxx11_
                    ((string *)
                     &func.super___shared_ptr<FunctionExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,peVar4);
          std::__cxx11::string::operator=
                    ((string *)
                     &labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (string *)
                     &func.super___shared_ptr<FunctionExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string
                    ((string *)
                     &func.super___shared_ptr<FunctionExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      std::shared_ptr<ArrayIndexingExpression>::~shared_ptr
                ((shared_ptr<ArrayIndexingExpression> *)local_d0);
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )value);
    iVar2 = (**peVar3->_vptr_Expression)();
    if (iVar2 == 7) {
      this_00 = &newClass.super___shared_ptr<NewClassExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::static_pointer_cast<FunctionExpression,Expression>((shared_ptr<Expression> *)this_00);
      this_02 = std::
                __shared_ptr_access<FunctionExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<FunctionExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this_00);
      FunctionExpression::SetName
                (this_02,(string *)
                         &labelExp_1.
                          super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::shared_ptr<FunctionExpression>::~shared_ptr
                ((shared_ptr<FunctionExpression> *)
                 &newClass.super___shared_ptr<NewClassExpression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      std::static_pointer_cast<NewClassExpression,Expression>((shared_ptr<Expression> *)local_130);
      this_03 = std::
                __shared_ptr_access<NewClassExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<NewClassExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_130);
      NewClassExpression::SetName
                (this_03,(string *)
                         &labelExp_1.
                          super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::shared_ptr<NewClassExpression>::~shared_ptr((shared_ptr<NewClassExpression> *)local_130);
    }
    peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )value);
    (*peVar3->_vptr_Expression[1])(peVar3,out,(ulong)(uint)n);
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  else {
    labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 0;
  }
  std::shared_ptr<ConstantExpression>::~shared_ptr((shared_ptr<ConstantExpression> *)local_68);
  std::__cxx11::string::~string
            ((string *)
             &labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ != 0) {
    return;
  }
LAB_00121b4e:
  std::shared_ptr<Expression>::shared_ptr(&local_158,key);
  ConstantExpression::AsLabelExpression((ConstantExpression *)local_148,&local_158);
  std::shared_ptr<Expression>::~shared_ptr(&local_158);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_148);
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<ConstantExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ConstantExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_148);
    ConstantExpression::GetLabel_abi_cxx11_(&local_178,peVar6);
    std::operator<<(out,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  else {
    std::operator<<(out,'[');
    peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )key);
    (*peVar3->_vptr_Expression[1])(peVar3,out,(ulong)(uint)n);
    std::operator<<(out,']');
  }
  std::operator<<(out," = ");
  peVar3 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      value);
  (*peVar3->_vptr_Expression[1])(peVar3,out,(ulong)(uint)n);
  if (eolChar != '\0') {
    std::operator<<(out,eolChar);
  }
  std::shared_ptr<ConstantExpression>::~shared_ptr((shared_ptr<ConstantExpression> *)local_148);
  return;
}

Assistant:

inline void TableBaseExpression::GenerateElementCode( ExpressionPtr key, ExpressionPtr value, char eolChar, std::ostream& out, int n ) const
{
	if (value->GetType() == Exp_Function || value->GetType() == Exp_NewClassExpression)
	{
		// Member function or nested class - find its name
		std::string name;
			
		shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
		if (labelExp)
		{
			name = labelExp->GetLabel();
		}
		else if (key->GetType() == Exp_Operator && static_pointer_cast<OperatorExpression>(key)->GetOperatorType() == OperatorExpression::OPER_ARRAYIND)
		{
			shared_ptr<ArrayIndexingExpression> derefExp = static_pointer_cast<ArrayIndexingExpression>(key);
			if (derefExp->IsSimpleMemberDeref())
			{
				if (value->GetType() == Exp_Function)
					name = derefExp->ToFunctionNameString();
				else
					name = derefExp->ToString();
			}
		}

		if (!name.empty())
		{
			if (value->GetType() == Exp_Function)
			{
				shared_ptr<FunctionExpression> func = static_pointer_cast<FunctionExpression>(value);
				func->SetName(name);
			}
			else
			{
				shared_ptr<NewClassExpression> newClass = static_pointer_cast<NewClassExpression>(value);
				newClass->SetName(name);
			}

			value->GenerateCode(out, n);
			out << std::endl;
			return;
		}
	}

	shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
	if (labelExp)
	{
		out << labelExp->GetLabel();
	}
	else
	{
		out << '[';
		key->GenerateCode(out, n);
		out << ']';
	}

	out << " = ";
	value->GenerateCode(out, n);

	if (eolChar != 0)
		out << eolChar;
}